

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

UChar * u_strchr32_63(UChar *s,UChar32 c)

{
  UChar *pUVar1;
  UChar UVar2;
  
  if ((uint)c < 0x10000) {
    pUVar1 = u_strchr_63(s,(UChar)c);
    return pUVar1;
  }
  if (((uint)c < 0x110000) && (UVar2 = *s, UVar2 != L'\0')) {
    do {
      pUVar1 = s + 1;
      if ((((uint)c >> 10) + 0xd7c0 == (uint)(ushort)UVar2) &&
         ((c & 0x3ffU | 0xdc00) == (uint)(ushort)*pUVar1)) {
        return s;
      }
      UVar2 = *pUVar1;
      s = pUVar1;
    } while (UVar2 != L'\0');
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strchr32(const UChar *s, UChar32 c) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_strchr(s, (UChar)c);
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        UChar cs, lead=U16_LEAD(c), trail=U16_TRAIL(c);

        while((cs=*s++)!=0) {
            if(cs==lead && *s==trail) {
                return (UChar *)(s-1);
            }
        }
        return NULL;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}